

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# crn_etc.cpp
# Opt level: O0

uint64 crnlib::pack_etc1_block
                 (etc1_block *dst_block,color_quad_u8 *pSrc_pixels,crn_etc1_pack_params *pack_params
                 ,pack_etc1_block_context *context)

{
  byte bVar1;
  byte bVar2;
  byte bVar3;
  byte bVar4;
  bool bVar5;
  int iVar6;
  uint64 uVar7;
  uint uVar8;
  results *local_2f0;
  bool *local_2b0;
  results *local_298;
  results *local_280;
  color_quad<unsigned_char,_int> *local_268;
  uint local_25c;
  uint b_1;
  uint i_2;
  uint8 *pSelectors;
  int subblock_1;
  uint b;
  int x;
  uint8 *pSelectors1;
  uint8 *pSelectors0;
  uint selector1;
  uint selector0;
  int db;
  int dg;
  int dr;
  uint refinement_error_thresh1;
  uint refinement_error_thresh0;
  color_quad_u8 subblock_pixel0;
  color_quad_u8 *pSrc_col;
  etc1_block *peStack_200;
  uint subblock;
  uint64 trial_error;
  uint use_color4;
  uint flip;
  params params;
  color_quad_u8 subblock_pixels [8];
  uint local_18c;
  undefined1 local_188 [4];
  uint i_1;
  results results [3];
  uint8 selectors [3] [8];
  undefined1 local_e8 [4];
  uint i;
  results best_results [2];
  uint8 best_selectors [2] [8];
  uint best_use_color4;
  uint best_flip;
  uint64 best_error;
  color_quad_u8 dithered_pixels [16];
  int r;
  color_quad_u8 src_pixel0;
  pack_etc1_block_context *context_local;
  crn_etc1_pack_params *pack_params_local;
  color_quad_u8 *pSrc_pixels_local;
  etc1_block *dst_block_local;
  
  color_quad<unsigned_char,_int>::color_quad(dithered_pixels + 0xf,pSrc_pixels);
  dithered_pixels[0xe].field_0 =
       (anon_union_4_3_dd316fa8_for_color_quad<unsigned_char,_int>_3)
       (anon_struct_4_4_d83cdc77_for_anon_union_4_3_dd316fa8_for_color_quad<unsigned_char,_int>_3_0)
       0xf;
  while ((((0 < (int)dithered_pixels[0xe].field_0 &&
           (pSrc_pixels[(int)dithered_pixels[0xe].field_0].field_0.field_0.r ==
            dithered_pixels[0xf].field_0.field_0.r)) &&
          (pSrc_pixels[(int)dithered_pixels[0xe].field_0].field_0.field_0.g ==
           dithered_pixels[0xf].field_0.field_0.g)) &&
         (pSrc_pixels[(int)dithered_pixels[0xe].field_0].field_0.field_0.b ==
          dithered_pixels[0xf].field_0.field_0.b))) {
    dithered_pixels[0xe].field_0 =
         (anon_union_4_3_dd316fa8_for_color_quad<unsigned_char,_int>_3)
         ((int)dithered_pixels[0xe].field_0 - 1);
  }
  if (dithered_pixels[0xe].field_0 == 0) {
    uVar7 = pack_etc1_block_solid_color(dst_block,(uint8 *)pSrc_pixels,pack_params,context);
    dst_block_local = (etc1_block *)(uVar7 << 4);
  }
  else {
    local_268 = (color_quad<unsigned_char,_int> *)&best_error;
    do {
      color_quad<unsigned_char,_int>::color_quad(local_268);
      local_268 = local_268 + 1;
    } while (local_268 != dithered_pixels + 0xe);
    pack_params_local = (crn_etc1_pack_params *)pSrc_pixels;
    if ((pack_params->m_dithering & 1U) != 0) {
      DitherBlock((color_quad_u8 *)&best_error,pSrc_pixels);
      pack_params_local = (crn_etc1_pack_params *)&best_error;
    }
    _best_use_color4 = (etc1_block *)0xffffffffffffffff;
    best_selectors[1][4] = '\0';
    best_selectors[1][5] = '\0';
    best_selectors[1][6] = '\0';
    best_selectors[1][7] = '\0';
    best_selectors[1][0] = '\0';
    best_selectors[1][1] = '\0';
    best_selectors[1][2] = '\0';
    best_selectors[1][3] = '\0';
    local_280 = (results *)local_e8;
    do {
      etc1_optimizer::results::results(local_280);
      local_280 = local_280 + 1;
    } while (local_280 != (results *)&best_results[1].m_block_color4);
    selectors[2][4] = '\0';
    selectors[2][5] = '\0';
    selectors[2][6] = '\0';
    selectors[2][7] = '\0';
    for (; (uint)selectors[2]._4_4_ < 2; selectors[2]._4_4_ = selectors[2]._4_4_ + 1) {
      best_results[(uint)selectors[2]._4_4_].m_block_color_unscaled.field_0.m_u32 = 8;
      *(uint8 (**) [8])&best_results[(uint)selectors[2]._4_4_].m_n =
           best_selectors + ((ulong)(uint)selectors[2]._4_4_ - 1);
    }
    local_298 = (results *)local_188;
    do {
      etc1_optimizer::results::results(local_298);
      local_298 = local_298 + 1;
    } while (local_298 != (results *)&results[2].m_block_color4);
    for (local_18c = 0; local_18c < 3; local_18c = local_18c + 1) {
      results[local_18c].m_block_color_unscaled.field_0.m_u32 = 8;
      *(uint8 (**) [8])&results[local_18c].m_n = selectors + ((ulong)local_18c - 1);
    }
    local_2b0 = &params.m_constrain_against_base_color5;
    do {
      color_quad<unsigned_char,_int>::color_quad((color_quad<unsigned_char,_int> *)local_2b0);
      local_2b0 = local_2b0 + 4;
    } while ((color_quad_u8 *)local_2b0 != subblock_pixels + 6);
    etc1_optimizer::params::params((params *)&use_color4,pack_params);
    params.super_crn_etc1_pack_params.m_quality = 8;
    params._8_8_ = &params.m_constrain_against_base_color5;
    for (trial_error._4_4_ = 0; trial_error._4_4_ < 2; trial_error._4_4_ = trial_error._4_4_ + 1) {
      for (trial_error._0_4_ = 0; (uint)trial_error < 2; trial_error._0_4_ = (uint)trial_error + 1)
      {
        peStack_200 = (etc1_block *)0x0;
        for (pSrc_col._4_4_ = 0; pSrc_col._4_4_ < 2; pSrc_col._4_4_ = pSrc_col._4_4_ + 1) {
          if (trial_error._4_4_ == 0) {
            _refinement_error_thresh0 = &pack_params_local->m_quality + (pSrc_col._4_4_ << 1);
            color_quad<unsigned_char,_int>::operator=
                      ((color_quad<unsigned_char,_int> *)&params.m_constrain_against_base_color5,
                       (color_quad<unsigned_char,_int> *)_refinement_error_thresh0);
            color_quad<unsigned_char,_int>::operator=
                      ((color_quad<unsigned_char,_int> *)&params.field_0x34,
                       (color_quad<unsigned_char,_int> *)(_refinement_error_thresh0 + 4));
            color_quad<unsigned_char,_int>::operator=
                      (subblock_pixels,
                       (color_quad<unsigned_char,_int> *)(_refinement_error_thresh0 + 8));
            color_quad<unsigned_char,_int>::operator=
                      (subblock_pixels + 1,
                       (color_quad<unsigned_char,_int> *)(_refinement_error_thresh0 + 0xc));
            color_quad<unsigned_char,_int>::operator=
                      (subblock_pixels + 2,
                       (color_quad<unsigned_char,_int> *)(_refinement_error_thresh0 + 1));
            color_quad<unsigned_char,_int>::operator=
                      (subblock_pixels + 3,
                       (color_quad<unsigned_char,_int> *)(_refinement_error_thresh0 + 5));
            color_quad<unsigned_char,_int>::operator=
                      (subblock_pixels + 4,
                       (color_quad<unsigned_char,_int> *)(_refinement_error_thresh0 + 9));
            color_quad<unsigned_char,_int>::operator=
                      (subblock_pixels + 5,
                       (color_quad<unsigned_char,_int> *)(_refinement_error_thresh0 + 0xd));
          }
          else {
            uVar8 = pSrc_col._4_4_ << 3;
            params._48_8_ = *(undefined8 *)(&pack_params_local->m_quality + uVar8);
            subblock_pixels._0_8_ = *(undefined8 *)(&pack_params_local[1].m_quality + uVar8);
            subblock_pixels._8_8_ = *(undefined8 *)(&pack_params_local[2].m_quality + uVar8);
            subblock_pixels._16_8_ = *(undefined8 *)(&pack_params_local[3].m_quality + uVar8);
          }
          results[1].m_block_color4 = true;
          results[1]._33_7_ = 0xffffffffffffff;
          if ((use_color4 != 0) && ((pSrc_col._4_4_ != 0 || ((uint)trial_error != 0)))) {
            color_quad<unsigned_char,_int>::color_quad
                      ((color_quad<unsigned_char,_int> *)&refinement_error_thresh1,
                       (color_quad<unsigned_char,_int> *)&params.m_constrain_against_base_color5);
            dithered_pixels[0xe].field_0 =
                 (anon_union_4_3_dd316fa8_for_color_quad<unsigned_char,_int>_3)
                 (anon_struct_4_4_d83cdc77_for_anon_union_4_3_dd316fa8_for_color_quad<unsigned_char,_int>_3_0
                  )0x7;
            while (((0 < (int)dithered_pixels[0xe].field_0 &&
                    (subblock_pixels[(long)(int)dithered_pixels[0xe].field_0 + -2].field_0.field_0.r
                     == (uchar)refinement_error_thresh1)) &&
                   ((subblock_pixels[(long)(int)dithered_pixels[0xe].field_0 + -2].field_0.field_0.g
                     == refinement_error_thresh1._1_1_ &&
                    (subblock_pixels[(long)(int)dithered_pixels[0xe].field_0 + -2].field_0.field_0.b
                     == refinement_error_thresh1._2_1_))))) {
              dithered_pixels[0xe].field_0 =
                   (anon_union_4_3_dd316fa8_for_color_quad<unsigned_char,_int>_3)
                   (anon_union_4_3_dd316fa8_for_color_quad<unsigned_char,_int>_3)
                   (dithered_pixels[0xe].field_0 - 1).field_0;
            }
            if (dithered_pixels[0xe].field_0 == 0) {
              if ((pSrc_col._4_4_ == 0) || ((uint)trial_error != 0)) {
                local_2f0 = (results *)0x0;
              }
              else {
                local_2f0 = results;
              }
              pack_etc1_block_solid_color_constrained
                        ((results *)&results[1].m_block_color4,8,(uint8 *)&refinement_error_thresh1,
                         pack_params,context,(bool)(((uint)trial_error != 0 ^ 0xffU) & 1),
                         (color_quad_u8 *)local_2f0);
            }
          }
          params.m_pSrc_pixels._0_1_ = (uint)trial_error != 0;
          params.m_scan_delta_size._0_1_ = 0;
          if (((uint)trial_error == 0) && (pSrc_col._4_4_ != 0)) {
            params.m_scan_delta_size._0_1_ = 1;
            color_quad<unsigned_char,_int>::operator=
                      ((color_quad<unsigned_char,_int> *)((long)&params.m_pScan_deltas + 4),
                       (color_quad<unsigned_char,_int> *)results);
          }
          if (use_color4 == 2) {
            params.m_pScan_deltas._0_4_ = 9;
            params._24_8_ = pack_etc1_block::s_scan_delta_0_to_4;
          }
          else if (use_color4 == 1) {
            params.m_pScan_deltas._0_4_ = 3;
            params._24_8_ = pack_etc1_block::s_scan_delta_0_to_1;
          }
          else {
            params.m_pScan_deltas._0_4_ = 1;
            params._24_8_ = pack_etc1_block::s_scan_delta_0;
          }
          etc1_optimizer::init(&context->m_optimizer,(EVP_PKEY_CTX *)&use_color4);
          bVar5 = etc1_optimizer::compute(&context->m_optimizer);
          if (!bVar5) break;
          if ((use_color4 != 0) && (3000 < *(ulong *)(local_188 + (ulong)pSrc_col._4_4_ * 0x28))) {
            if (use_color4 == 1) {
              params.m_pScan_deltas._0_4_ = 4;
              params._24_8_ = pack_etc1_block::s_scan_delta_2_to_3;
            }
            else if (*(ulong *)(local_188 + (ulong)pSrc_col._4_4_ * 0x28) < 0x1771) {
              params.m_pScan_deltas._0_4_ = 2;
              params._24_8_ = pack_etc1_block::s_scan_delta_5_to_5;
            }
            else {
              params.m_pScan_deltas._0_4_ = 8;
              params._24_8_ = pack_etc1_block::s_scan_delta_5_to_8;
            }
            bVar5 = etc1_optimizer::compute(&context->m_optimizer);
            if (!bVar5) break;
          }
          if ((ulong)results[1]._32_8_ < *(ulong *)(local_188 + (ulong)pSrc_col._4_4_ * 0x28)) {
            etc1_optimizer::results::operator=
                      ((results *)(local_188 + (ulong)pSrc_col._4_4_ * 0x28),
                       (results *)&results[1].m_block_color4);
          }
          peStack_200 = (etc1_block *)
                        (peStack_200->m_low_color +
                        *(long *)(local_188 + (ulong)pSrc_col._4_4_ * 0x28) + -8);
          if (_best_use_color4 <= peStack_200) break;
        }
        if (1 < pSrc_col._4_4_) {
          _best_use_color4 = peStack_200;
          etc1_optimizer::results::operator=((results *)local_e8,(results *)local_188);
          etc1_optimizer::results::operator=
                    ((results *)&best_results[0].m_block_color4,
                     (results *)&results[0].m_block_color4);
          best_selectors[1][4] = trial_error._4_1_;
          best_selectors[1][5] = trial_error._5_1_;
          best_selectors[1][6] = trial_error._6_1_;
          best_selectors[1][7] = trial_error._7_1_;
          best_selectors[1][0] = (undefined1)trial_error;
          best_selectors[1][1] = trial_error._1_1_;
          best_selectors[1][2] = trial_error._2_1_;
          best_selectors[1][3] = trial_error._3_1_;
        }
      }
    }
    db = (uint)(byte)best_results[1].m_error - (uint)(byte)best_results[0].m_error;
    selector0 = (uint)best_results[1].m_error._1_1_ - (uint)best_results[0].m_error._1_1_;
    selector1 = (uint)best_results[1].m_error._2_1_ - (uint)best_results[0].m_error._2_1_;
    if ((best_selectors[1]._0_4_ == 0) &&
       ((iVar6 = math::minimum<int>(db,selector0,selector1), iVar6 < -4 ||
        (iVar6 = math::maximum<int>(db,selector0,selector1), 3 < iVar6)))) {
      crnlib_assert("0",
                    "/workspace/llm4binary/github/license_all_cmakelists_1510/FrozenStormInteractive[P]Crunch2/crnlib/crn_etc.cpp"
                    ,0x6f0);
    }
    if (best_selectors[1]._0_4_ == 0) {
      if (db < 0) {
        db = db + 8;
      }
      if ((int)selector0 < 0) {
        selector0 = selector0 + 8;
      }
      if ((int)selector1 < 0) {
        selector1 = selector1 + 8;
      }
      (dst_block->field_0).m_bytes[0] = (byte)best_results[0].m_error << 3 | (byte)db;
      (dst_block->field_0).m_bytes[1] = best_results[0].m_error._1_1_ << 3 | (byte)selector0;
      (dst_block->field_0).m_bytes[2] = best_results[0].m_error._2_1_ << 3 | (byte)selector1;
    }
    else {
      (dst_block->field_0).m_bytes[0] =
           (byte)best_results[1].m_error | (byte)best_results[0].m_error << 4;
      (dst_block->field_0).m_bytes[1] =
           best_results[1].m_error._1_1_ | best_results[0].m_error._1_1_ << 4;
      (dst_block->field_0).m_bytes[2] =
           best_results[1].m_error._2_1_ | best_results[0].m_error._2_1_ << 4;
    }
    (dst_block->field_0).m_bytes[3] =
         (byte)(best_results[1].m_error._4_4_ << 2) | (byte)(best_results[0].m_error._4_4_ << 5) |
         (byte)(((best_selectors[1]._0_4_ ^ 0xffffffff) & 1) << 1) | (byte)best_selectors[1]._4_4_;
    pSelectors0._4_4_ = 0;
    pSelectors0._0_4_ = 0;
    if (best_selectors[1]._4_4_ == 0) {
      pSelectors._4_4_ = 1;
      while( true ) {
        if (pSelectors._4_4_ < 0) break;
        _b_1 = (byte *)(*(long *)&best_results[pSelectors._4_4_].m_n + 4);
        for (local_25c = 0; local_25c < 2; local_25c = local_25c + 1) {
          pSelectors0._4_4_ =
               (((pSelectors0._4_4_ << 1 |
                 *(byte *)((long)&g_selector_index_to_etc1 + (ulong)_b_1[3]) & 1) << 1 |
                *(byte *)((long)&g_selector_index_to_etc1 + (ulong)_b_1[2]) & 1) << 1 |
               *(byte *)((long)&g_selector_index_to_etc1 + (ulong)_b_1[1]) & 1) << 1 |
               *(byte *)((long)&g_selector_index_to_etc1 + (ulong)*_b_1) & 1;
          pSelectors0._0_4_ =
               ((((uint)pSelectors0 << 1 |
                 (uint)(*(byte *)((long)&g_selector_index_to_etc1 + (ulong)_b_1[3]) >> 1)) << 1 |
                (uint)(*(byte *)((long)&g_selector_index_to_etc1 + (ulong)_b_1[2]) >> 1)) << 1 |
               (uint)(*(byte *)((long)&g_selector_index_to_etc1 + (ulong)_b_1[1]) >> 1)) << 1 |
               (uint)(*(byte *)((long)&g_selector_index_to_etc1 + (ulong)*_b_1) >> 1);
          _b_1 = _b_1 + -4;
        }
        pSelectors._4_4_ = pSelectors._4_4_ + -1;
      }
    }
    else {
      subblock_1 = 3;
      while( true ) {
        if (subblock_1 < 0) break;
        bVar1 = *(byte *)((long)&g_selector_index_to_etc1 +
                         (ulong)*(byte *)(best_results[1]._16_8_ + (long)(subblock_1 + 4)));
        bVar2 = *(byte *)((long)&g_selector_index_to_etc1 +
                         (ulong)*(byte *)(best_results[1]._16_8_ + (long)subblock_1));
        bVar3 = *(byte *)((long)&g_selector_index_to_etc1 +
                         (ulong)*(byte *)(best_results[0]._16_8_ + (long)(subblock_1 + 4)));
        bVar4 = *(byte *)((long)&g_selector_index_to_etc1 +
                         (ulong)*(byte *)(best_results[0]._16_8_ + (long)subblock_1));
        pSelectors0._4_4_ =
             (((pSelectors0._4_4_ << 1 | bVar1 & 1) << 1 | bVar2 & 1) << 1 | bVar3 & 1) << 1 |
             bVar4 & 1;
        pSelectors0._0_4_ =
             ((((uint)pSelectors0 << 1 | (uint)(bVar1 >> 1)) << 1 | (uint)(bVar2 >> 1)) << 1 |
             (uint)(bVar3 >> 1)) << 1 | (uint)(bVar4 >> 1);
        subblock_1 = subblock_1 + -1;
      }
    }
    (dst_block->field_0).m_bytes[4] = (uint8)((ushort)pSelectors0._0_2_ >> 8);
    (dst_block->field_0).m_bytes[5] = (uint8)pSelectors0._0_2_;
    (dst_block->field_0).m_bytes[6] = (uint8)((ushort)pSelectors0._4_2_ >> 8);
    (dst_block->field_0).m_bytes[7] = (uint8)pSelectors0._4_2_;
    dst_block_local = _best_use_color4;
  }
  return (uint64)dst_block_local;
}

Assistant:

uint64 pack_etc1_block(etc1_block& dst_block, const color_quad_u8* pSrc_pixels, crn_etc1_pack_params& pack_params, pack_etc1_block_context& context)
    {
        color_quad_u8 src_pixel0(pSrc_pixels[0]);

        int r;
        for (r = 15; r >= 1; --r)
        {
            if ((pSrc_pixels[r].r != src_pixel0.r) || (pSrc_pixels[r].g != src_pixel0.g) || (pSrc_pixels[r].b != src_pixel0.b))
            {
                break;
            }
        }
        if (!r)
        {
            return 16 * pack_etc1_block_solid_color(dst_block, &pSrc_pixels[0].r, pack_params, context);
        }

        color_quad_u8 dithered_pixels[16];
        if (pack_params.m_dithering)
        {
            DitherBlock(dithered_pixels, pSrc_pixels);
            pSrc_pixels = dithered_pixels;
        }

        uint64 best_error = cUINT64_MAX;
        uint best_flip = false, best_use_color4 = false;

        uint8 best_selectors[2][8];
        etc1_optimizer::results best_results[2];
        for (uint i = 0; i < 2; i++)
        {
            best_results[i].m_n = 8;
            best_results[i].m_pSelectors = best_selectors[i];
        }

        uint8 selectors[3][8];
        etc1_optimizer::results results[3];

        for (uint i = 0; i < 3; i++)
        {
            results[i].m_n = 8;
            results[i].m_pSelectors = selectors[i];
        }

        color_quad_u8 subblock_pixels[8];

        etc1_optimizer::params params(pack_params);
        params.m_num_src_pixels = 8;
        params.m_pSrc_pixels = subblock_pixels;

        for (uint flip = 0; flip < 2; flip++)
        {
            for (uint use_color4 = 0; use_color4 < 2; use_color4++)
            {
                uint64 trial_error = 0;

                uint subblock;
                for (subblock = 0; subblock < 2; subblock++)
                {
                    if (flip)
                    {
                        memcpy(subblock_pixels, pSrc_pixels + subblock * 8, sizeof(color_quad_u8) * 8);
                    }
                    else
                    {
                        const color_quad_u8* pSrc_col = pSrc_pixels + subblock * 2;
                        subblock_pixels[0] = pSrc_col[0];
                        subblock_pixels[1] = pSrc_col[4];
                        subblock_pixels[2] = pSrc_col[8];
                        subblock_pixels[3] = pSrc_col[12];
                        subblock_pixels[4] = pSrc_col[1];
                        subblock_pixels[5] = pSrc_col[5];
                        subblock_pixels[6] = pSrc_col[9];
                        subblock_pixels[7] = pSrc_col[13];
                    }

                    results[2].m_error = cUINT64_MAX;
                    if ((params.m_quality >= cCRNETCQualityMedium) && ((subblock) || (use_color4)))
                    {
                        color_quad_u8 subblock_pixel0(subblock_pixels[0]);
                        for (r = 7; r >= 1; --r)
                        {
                            if ((subblock_pixels[r].r != subblock_pixel0.r) || (subblock_pixels[r].g != subblock_pixel0.g) || (subblock_pixels[r].b != subblock_pixel0.b))
                            {
                                break;
                            }
                        }
                        if (!r)
                        {
                            pack_etc1_block_solid_color_constrained(results[2], 8, &subblock_pixel0.r, pack_params, context, !use_color4, (subblock && !use_color4) ? &results[0].m_block_color_unscaled : nullptr);
                        }
                    }

                    params.m_use_color4 = (use_color4 != 0);
                    params.m_constrain_against_base_color5 = false;

                    if ((!use_color4) && (subblock))
                    {
                        params.m_constrain_against_base_color5 = true;
                        params.m_base_color5 = results[0].m_block_color_unscaled;
                    }

                    if (params.m_quality == cCRNETCQualitySlow)
                    {
                        static const int s_scan_delta_0_to_4[] = { -4, -3, -2, -1, 0, 1, 2, 3, 4 };
                        params.m_scan_delta_size = CRNLIB_ARRAY_SIZE(s_scan_delta_0_to_4);
                        params.m_pScan_deltas = s_scan_delta_0_to_4;
                    }
                    else if (params.m_quality == cCRNETCQualityMedium)
                    {
                        static const int s_scan_delta_0_to_1[] = { -1, 0, 1 };
                        params.m_scan_delta_size = CRNLIB_ARRAY_SIZE(s_scan_delta_0_to_1);
                        params.m_pScan_deltas = s_scan_delta_0_to_1;
                    }
                    else
                    {
                        static const int s_scan_delta_0[] = { 0 };
                        params.m_scan_delta_size = CRNLIB_ARRAY_SIZE(s_scan_delta_0);
                        params.m_pScan_deltas = s_scan_delta_0;
                    }

                    context.m_optimizer.init(params, results[subblock]);

                    if (!context.m_optimizer.compute())
                    {
                        break;
                    }

                    // Fairly arbitrary/unrefined thresholds that control how far away to scan for potentially better solutions.
                    const uint refinement_error_thresh0 = 3000;
                    const uint refinement_error_thresh1 = 6000;
                    if ((params.m_quality >= cCRNETCQualityMedium) && (results[subblock].m_error > refinement_error_thresh0))
                    {
                        if (params.m_quality == cCRNETCQualityMedium)
                        {
                            static const int s_scan_delta_2_to_3[] = { -3, -2, 2, 3 };
                            params.m_scan_delta_size = CRNLIB_ARRAY_SIZE(s_scan_delta_2_to_3);
                            params.m_pScan_deltas = s_scan_delta_2_to_3;
                        }
                        else
                        {
                            static const int s_scan_delta_5_to_5[] = { -5, 5 };
                            static const int s_scan_delta_5_to_8[] = { -8, -7, -6, -5, 5, 6, 7, 8 };
                            if (results[subblock].m_error > refinement_error_thresh1)
                            {
                                params.m_scan_delta_size = CRNLIB_ARRAY_SIZE(s_scan_delta_5_to_8);
                                params.m_pScan_deltas = s_scan_delta_5_to_8;
                            }
                            else
                            {
                                params.m_scan_delta_size = CRNLIB_ARRAY_SIZE(s_scan_delta_5_to_5);
                                params.m_pScan_deltas = s_scan_delta_5_to_5;
                            }
                        }

                        if (!context.m_optimizer.compute())
                        {
                            break;
                        }
                    }

                    if (results[2].m_error < results[subblock].m_error)
                    {
                        results[subblock] = results[2];
                    }

                    trial_error += results[subblock].m_error;
                    if (trial_error >= best_error)
                    {
                        break;
                    }
                }

                if (subblock < 2)
                {
                    continue;
                }

                best_error = trial_error;
                best_results[0] = results[0];
                best_results[1] = results[1];
                best_flip = flip;
                best_use_color4 = use_color4;

            } // use_color4

        } // flip

        int dr = best_results[1].m_block_color_unscaled.r - best_results[0].m_block_color_unscaled.r;
        int dg = best_results[1].m_block_color_unscaled.g - best_results[0].m_block_color_unscaled.g;
        int db = best_results[1].m_block_color_unscaled.b - best_results[0].m_block_color_unscaled.b;
        if (!best_use_color4)
        {
            if ((math::minimum(dr, dg, db) < cETC1ColorDeltaMin) || (math::maximum(dr, dg, db) > cETC1ColorDeltaMax))
            {
                // Shouldn't ever happen
                CRNLIB_VERIFY(0);
            }
        }

        if (best_use_color4)
        {
            dst_block.m_bytes[0] = static_cast<uint8>(best_results[1].m_block_color_unscaled.r | (best_results[0].m_block_color_unscaled.r << 4));
            dst_block.m_bytes[1] = static_cast<uint8>(best_results[1].m_block_color_unscaled.g | (best_results[0].m_block_color_unscaled.g << 4));
            dst_block.m_bytes[2] = static_cast<uint8>(best_results[1].m_block_color_unscaled.b | (best_results[0].m_block_color_unscaled.b << 4));
        }
        else
        {
            if (dr < 0)
            {
                dr += 8;
            }
            if (dg < 0)
            {
                dg += 8;
            }
            if (db < 0)
            {
                db += 8;
            }
            dst_block.m_bytes[0] = static_cast<uint8>((best_results[0].m_block_color_unscaled.r << 3) | dr);
            dst_block.m_bytes[1] = static_cast<uint8>((best_results[0].m_block_color_unscaled.g << 3) | dg);
            dst_block.m_bytes[2] = static_cast<uint8>((best_results[0].m_block_color_unscaled.b << 3) | db);
        }

        dst_block.m_bytes[3] = static_cast<uint8>((best_results[1].m_block_inten_table << 2) | (best_results[0].m_block_inten_table << 5) | ((~best_use_color4 & 1) << 1) | best_flip);

        uint selector0 = 0, selector1 = 0;
        if (best_flip)
        {
            // flipped:
            // { 0, 0 }, { 1, 0 }, { 2, 0 }, { 3, 0 },
            // { 0, 1 }, { 1, 1 }, { 2, 1 }, { 3, 1 }
            //
            // { 0, 2 }, { 1, 2 }, { 2, 2 }, { 3, 2 },
            // { 0, 3 }, { 1, 3 }, { 2, 3 }, { 3, 3 }
            const uint8* pSelectors0 = best_results[0].m_pSelectors;
            const uint8* pSelectors1 = best_results[1].m_pSelectors;
            for (int x = 3; x >= 0; --x)
            {
                uint b;
                b = g_selector_index_to_etc1[pSelectors1[4 + x]];
                selector0 = (selector0 << 1) | (b & 1);
                selector1 = (selector1 << 1) | (b >> 1);

                b = g_selector_index_to_etc1[pSelectors1[x]];
                selector0 = (selector0 << 1) | (b & 1);
                selector1 = (selector1 << 1) | (b >> 1);

                b = g_selector_index_to_etc1[pSelectors0[4 + x]];
                selector0 = (selector0 << 1) | (b & 1);
                selector1 = (selector1 << 1) | (b >> 1);

                b = g_selector_index_to_etc1[pSelectors0[x]];
                selector0 = (selector0 << 1) | (b & 1);
                selector1 = (selector1 << 1) | (b >> 1);
            }
        }
        else
        {
            // non-flipped:
            // { 0, 0 }, { 0, 1 }, { 0, 2 }, { 0, 3 },
            // { 1, 0 }, { 1, 1 }, { 1, 2 }, { 1, 3 }
            //
            // { 2, 0 }, { 2, 1 }, { 2, 2 }, { 2, 3 },
            // { 3, 0 }, { 3, 1 }, { 3, 2 }, { 3, 3 }
            for (int subblock = 1; subblock >= 0; --subblock)
            {
                const uint8* pSelectors = best_results[subblock].m_pSelectors + 4;
                for (uint i = 0; i < 2; i++)
                {
                    uint b;
                    b = g_selector_index_to_etc1[pSelectors[3]];
                    selector0 = (selector0 << 1) | (b & 1);
                    selector1 = (selector1 << 1) | (b >> 1);

                    b = g_selector_index_to_etc1[pSelectors[2]];
                    selector0 = (selector0 << 1) | (b & 1);
                    selector1 = (selector1 << 1) | (b >> 1);

                    b = g_selector_index_to_etc1[pSelectors[1]];
                    selector0 = (selector0 << 1) | (b & 1);
                    selector1 = (selector1 << 1) | (b >> 1);

                    b = g_selector_index_to_etc1[pSelectors[0]];
                    selector0 = (selector0 << 1) | (b & 1);
                    selector1 = (selector1 << 1) | (b >> 1);

                    pSelectors -= 4;
                }
            }
        }

        dst_block.m_bytes[4] = static_cast<uint8>(selector1 >> 8);
        dst_block.m_bytes[5] = static_cast<uint8>(selector1 & 0xFF);
        dst_block.m_bytes[6] = static_cast<uint8>(selector0 >> 8);
        dst_block.m_bytes[7] = static_cast<uint8>(selector0 & 0xFF);

        return best_error;
    }